

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result __thiscall wabt::interp::Table::Grow(Table *this,Store *store,u32 count,Ref ref)

{
  bool bVar1;
  uint local_3c;
  size_type sStack_38;
  u32 new_size;
  size_t old_size;
  Store *pSStack_28;
  u32 count_local;
  Store *store_local;
  Table *this_local;
  Ref ref_local;
  
  old_size._4_4_ = count;
  pSStack_28 = store;
  store_local = (Store *)this;
  this_local = (Table *)ref.index;
  sStack_38 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::size
                        (&this->elements_);
  bVar1 = Store::HasValueType(pSStack_28,(Ref)this_local,
                              (ValueType)*(Enum *)&(this->type_).super_ExternType.field_0xc);
  if ((bVar1) &&
     (bVar1 = CanGrow(&(this->type_).limits,(u32)sStack_38,old_size._4_4_,&local_3c), bVar1)) {
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::resize
              (&this->elements_,(ulong)local_3c);
    Fill(this,pSStack_28,(u32)sStack_38,(Ref)this_local,local_3c - (u32)sStack_38);
    Result::Result((Result *)((long)&ref_local.index + 4),Ok);
  }
  else {
    Result::Result((Result *)((long)&ref_local.index + 4),Error);
  }
  return (Result)ref_local.index._4_4_;
}

Assistant:

Result Table::Grow(Store& store, u32 count, Ref ref) {
  size_t old_size = elements_.size();
  u32 new_size;
  if (store.HasValueType(ref, type_.element) &&
      CanGrow(type_.limits, old_size, count, &new_size)) {
    elements_.resize(new_size);
    Fill(store, old_size, ref, new_size - old_size);
    return Result::Ok;
  }
  return Result::Error;
}